

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-list.c
# Opt level: O0

void monster_list_get_glyphs(monster_list_t *list)

{
  _Bool _Var1;
  monster_list_entry_t *pmVar2;
  monster_list_entry_t *entry;
  wchar_t i;
  monster_list_t *list_local;
  
  for (entry._4_4_ = 0; entry._4_4_ < (int)list->entries_size; entry._4_4_ = entry._4_4_ + 1) {
    pmVar2 = list->entries + entry._4_4_;
    if (pmVar2->race != (monster_race *)0x0) {
      if (pmVar2->attr == '\0') {
        pmVar2->attr = monster_x_attr[pmVar2->race->ridx];
      }
      if ((((pmVar2->attr & 0x80) == 0) && (((player->opts).opt[0x10] & 1U) != 0)) &&
         (_Var1 = flag_has_dbg(pmVar2->race->flags,0xc,1,"entry->race->flags","RF_UNIQUE"), _Var1))
      {
        pmVar2->attr = '\x11';
      }
    }
  }
  return;
}

Assistant:

static void monster_list_get_glyphs(monster_list_t *list)
{
	int i;

	/* Run through all monsters in the list. */
	for (i = 0; i < (int)list->entries_size; i++) {
		monster_list_entry_t *entry = &list->entries[i];
		if (entry->race == NULL)
			continue;

		/* If no monster attribute use the standard UI picture. */
		if (!entry->attr)
			entry->attr = monster_x_attr[entry->race->ridx];
		/* If purple_uniques is relevant, apply it. */
		if (!(entry->attr & 0x80) && OPT(player, purple_uniques)
				&& rf_has(entry->race->flags, RF_UNIQUE)) {
			entry->attr = COLOUR_VIOLET;
		}
	}
}